

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::OperatorResolver::visit(OperatorResolver *this,WriteToEndpoint *w)

{
  size_t *psVar1;
  Allocator *allocator;
  EndpointDeclaration *endpoint;
  bool bVar2;
  int iVar3;
  WriteToEndpoint *pWVar4;
  OutputEndpointRef *pOVar5;
  pool_ptr<soul::AST::OutputEndpointRef> outputEndpoint;
  pool_ptr<soul::AST::OutputEndpointRef> local_48;
  Type local_40;
  pool_ref<soul::AST::Expression> local_28;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,w);
  iVar3 = (*(w->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(w);
  if ((char)iVar3 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    pWVar4 = ASTUtilities::getTopLevelWriteToEndpoint(w);
    local_28.object = (pWVar4->target).object;
    cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&local_48,&local_28);
    if (local_48.object != (OutputEndpointRef *)0x0) {
      pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_48);
      bVar2 = ASTUtilities::isConsoleEndpoint((pOVar5->output).object);
      if (bVar2) {
        allocator = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_48);
        endpoint = (pOVar5->output).object;
        (*(((w->value).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_40);
        ASTUtilities::ensureEventEndpointSupportsType(allocator,endpoint,&local_40);
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
      }
    }
  }
  return &w->super_Expression;
}

Assistant:

AST::Expression& visit (AST::WriteToEndpoint& w) override
        {
            super::visit (w);

            if (! w.isResolved())
            {
                ++numFails;
                return w;
            }

            auto& topLevelWrite = ASTUtilities::getTopLevelWriteToEndpoint (w);

            // Either an OutputEndpointRef, or an ArrayElementRef of an OutputEndpointRef
            if (auto outputEndpoint = cast<AST::OutputEndpointRef> (topLevelWrite.target))
                if (ASTUtilities::isConsoleEndpoint (outputEndpoint->output))
                    ASTUtilities::ensureEventEndpointSupportsType (allocator, outputEndpoint->output, w.value->getResultType());

            return w;
        }